

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O1

void test_bson_json_inc(void)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int __fd;
  undefined1 *puVar5;
  void *pvVar6;
  void *pvVar7;
  undefined8 uVar8;
  undefined1 *puVar9;
  void *__s1;
  void *__s2;
  undefined8 uVar10;
  ulong uVar11;
  long lVar12;
  undefined1 *unaff_R12;
  undefined1 *unaff_R13;
  undefined1 *puVar13;
  void *unaff_R14;
  ulong unaff_R15;
  bson_t b;
  bson_error_t error;
  undefined1 auStack_1400 [4];
  uint uStack_13fc;
  undefined1 auStack_1380 [4];
  uint uStack_137c;
  undefined1 auStack_1300 [200];
  undefined1 auStack_1238 [648];
  undefined1 *puStack_fb0;
  undefined1 *puStack_fa8;
  undefined1 *puStack_fa0;
  void *pvStack_f98;
  ulong uStack_f90;
  code *pcStack_f88;
  undefined1 auStack_f80 [4];
  uint uStack_f7c;
  undefined1 auStack_f00 [4];
  uint uStack_efc;
  undefined1 auStack_e38 [648];
  undefined1 *puStack_bb0;
  undefined1 *puStack_ba8;
  undefined1 *puStack_ba0;
  void *pvStack_b98;
  ulong uStack_b90;
  code *pcStack_b88;
  undefined1 auStack_b80 [4];
  uint uStack_b7c;
  undefined1 auStack_b00 [4];
  uint uStack_afc;
  undefined1 auStack_a38 [648];
  undefined1 *puStack_7b0;
  undefined1 *puStack_7a8;
  undefined1 *puStack_7a0;
  void *pvStack_798;
  ulong uStack_790;
  code *pcStack_788;
  undefined1 auStack_780 [4];
  uint uStack_77c;
  undefined1 auStack_700 [4];
  uint uStack_6fc;
  undefined1 auStack_638 [648];
  code *pcStack_388;
  undefined1 auStack_380 [240];
  undefined1 local_290 [648];
  
  pcStack_388 = (code *)0x12eb50;
  cVar1 = bson_init_from_json(auStack_380,"{ \"$inc\" : { \"ref\" : 1 } }",0xffffffffffffffff,
                              local_290);
  if (cVar1 != '\0') {
    pcStack_388 = (code *)0x12eb5c;
    bson_destroy(auStack_380);
    return;
  }
  pcStack_388 = test_bson_json_array;
  test_bson_json_inc_cold_1();
  puVar5 = auStack_780;
  puVar13 = auStack_780;
  pcStack_788 = (code *)0x12eb91;
  pcStack_388 = (code *)&stack0xfffffffffffffff8;
  bson_init(auStack_780);
  pcStack_788 = (code *)0x12eba7;
  bson_append_int32(auStack_780,"0",1,0);
  pcStack_788 = (code *)0x12ebc0;
  bson_append_int32(auStack_780,"1",1,1);
  pcStack_788 = (code *)0x12ebd9;
  bson_append_int32(auStack_780,"2",1,2);
  pcStack_788 = (code *)0x12ebf2;
  bson_append_int32(auStack_780,"3",1,3);
  pcStack_788 = (code *)0x12ec15;
  cVar1 = bson_init_from_json(auStack_700,"[ 0, 1, 2, 3 ]",0xffffffffffffffff,auStack_638);
  if (cVar1 != '\0') {
    pcStack_788 = (code *)0x12ec2d;
    unaff_R14 = (void *)bson_get_data(auStack_700);
    pcStack_788 = (code *)0x12ec3b;
    puVar5 = (undefined1 *)bson_get_data(auStack_780);
    if (uStack_77c == uStack_6fc) {
      pcStack_788 = (code *)0x12ec54;
      pvVar6 = (void *)bson_get_data(auStack_780);
      pcStack_788 = (code *)0x12ec64;
      pvVar7 = (void *)bson_get_data(auStack_700);
      pcStack_788 = (code *)0x12ec73;
      iVar2 = bcmp(pvVar6,pvVar7,(ulong)uStack_77c);
      if (iVar2 == 0) {
        pcStack_788 = (code *)0x12ec7f;
        bson_destroy(auStack_780);
        pcStack_788 = (code *)0x12ec8c;
        bson_destroy(auStack_700);
        return;
      }
    }
    unaff_R12 = auStack_700;
    pcStack_788 = (code *)0x12ecad;
    uVar8 = bson_as_canonical_extended_json(unaff_R12,0);
    pcStack_788 = (code *)0x12ecbd;
    bson_as_canonical_extended_json(auStack_780,0);
    uVar3 = uStack_77c;
    if (uStack_6fc < uStack_77c) {
      uVar3 = uStack_6fc;
    }
    uVar4 = 0xffffffff;
    if (uVar3 != 0) {
      uVar3 = uStack_77c;
      if (uStack_6fc <= uStack_77c) {
        uVar3 = uStack_6fc;
      }
      lVar12 = 0;
      do {
        if (*(char *)((long)unaff_R14 + lVar12) != puVar5[lVar12]) {
          uVar4 = (uint)lVar12;
          break;
        }
        lVar12 = lVar12 + 1;
      } while (uVar3 != (uint)lVar12);
    }
    uVar3 = uStack_6fc;
    if (uStack_6fc < uStack_77c) {
      uVar3 = uStack_77c;
    }
    uVar3 = uVar3 - 1;
    if (uVar4 != 0xffffffff) {
      uVar3 = uVar4;
    }
    pcStack_788 = (code *)0x12ed24;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",(ulong)uVar3,uVar8);
    pcStack_788 = (code *)0x12ed3c;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    unaff_R15 = (ulong)uVar3;
    pcStack_788 = (code *)0x12ed57;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    if (uVar3 == 0xffffffff) {
LAB_0012eda3:
      pcStack_788 = (code *)0x12eda8;
      test_bson_json_array_cold_6();
LAB_0012eda8:
      pcStack_788 = (code *)0x12edad;
      test_bson_json_array_cold_5();
LAB_0012edad:
      pcStack_788 = (code *)0x12edb2;
      test_bson_json_array_cold_2();
    }
    else {
      unaff_R12 = (undefined1 *)(ulong)uVar4;
      puVar13 = auStack_780;
      if (uVar4 == 0xffffffff) goto LAB_0012eda8;
      puVar13 = (undefined1 *)(ulong)uStack_6fc;
      pcStack_788 = (code *)0x12ed7b;
      puVar9 = (undefined1 *)write(uVar3,unaff_R14,(size_t)puVar13);
      if (puVar9 != puVar13) goto LAB_0012edad;
      unaff_R14 = (void *)(ulong)uStack_77c;
      pcStack_788 = (code *)0x12ed93;
      pvVar6 = (void *)write(uVar4,puVar5,(size_t)unaff_R14);
      if (pvVar6 == unaff_R14) {
        pcStack_788 = (code *)0x12eda3;
        test_bson_json_array_cold_4();
        goto LAB_0012eda3;
      }
    }
    pcStack_788 = (code *)0x12edb7;
    test_bson_json_array_cold_3();
    unaff_R13 = puVar13;
  }
  pcStack_788 = test_bson_json_array_single;
  test_bson_json_array_cold_1();
  puVar9 = auStack_b80;
  puVar13 = auStack_b80;
  pcStack_b88 = (code *)0x12ede7;
  puStack_7b0 = puVar5;
  puStack_7a8 = unaff_R12;
  puStack_7a0 = unaff_R13;
  pvStack_798 = unaff_R14;
  uStack_790 = unaff_R15;
  pcStack_788 = (code *)&pcStack_388;
  bson_init(auStack_b80);
  pcStack_b88 = (code *)0x12edfd;
  bson_append_int32(auStack_b80,"0",1,0);
  pcStack_b88 = (code *)0x12ee20;
  cVar1 = bson_init_from_json(auStack_b00,"[ 0 ]",0xffffffffffffffff,auStack_a38);
  if (cVar1 != '\0') {
    pcStack_b88 = (code *)0x12ee38;
    unaff_R14 = (void *)bson_get_data(auStack_b00);
    pcStack_b88 = (code *)0x12ee46;
    puVar9 = (undefined1 *)bson_get_data(auStack_b80);
    if (uStack_b7c == uStack_afc) {
      pcStack_b88 = (code *)0x12ee5f;
      pvVar6 = (void *)bson_get_data(auStack_b80);
      pcStack_b88 = (code *)0x12ee6f;
      pvVar7 = (void *)bson_get_data(auStack_b00);
      pcStack_b88 = (code *)0x12ee7e;
      iVar2 = bcmp(pvVar6,pvVar7,(ulong)uStack_b7c);
      if (iVar2 == 0) {
        pcStack_b88 = (code *)0x12ee8a;
        bson_destroy(auStack_b80);
        pcStack_b88 = (code *)0x12ee97;
        bson_destroy(auStack_b00);
        return;
      }
    }
    unaff_R12 = auStack_b00;
    pcStack_b88 = (code *)0x12eeb8;
    uVar8 = bson_as_canonical_extended_json(unaff_R12,0);
    pcStack_b88 = (code *)0x12eec8;
    bson_as_canonical_extended_json(auStack_b80,0);
    uVar3 = uStack_b7c;
    if (uStack_afc < uStack_b7c) {
      uVar3 = uStack_afc;
    }
    uVar4 = 0xffffffff;
    if (uVar3 != 0) {
      uVar3 = uStack_b7c;
      if (uStack_afc <= uStack_b7c) {
        uVar3 = uStack_afc;
      }
      lVar12 = 0;
      do {
        if (*(char *)((long)unaff_R14 + lVar12) != puVar9[lVar12]) {
          uVar4 = (uint)lVar12;
          break;
        }
        lVar12 = lVar12 + 1;
      } while (uVar3 != (uint)lVar12);
    }
    uVar3 = uStack_afc;
    if (uStack_afc < uStack_b7c) {
      uVar3 = uStack_b7c;
    }
    uVar3 = uVar3 - 1;
    if (uVar4 != 0xffffffff) {
      uVar3 = uVar4;
    }
    pcStack_b88 = (code *)0x12ef2f;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",(ulong)uVar3,uVar8);
    pcStack_b88 = (code *)0x12ef47;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    unaff_R15 = (ulong)uVar3;
    pcStack_b88 = (code *)0x12ef62;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    if (uVar3 == 0xffffffff) {
LAB_0012efae:
      pcStack_b88 = (code *)0x12efb3;
      test_bson_json_array_single_cold_6();
LAB_0012efb3:
      pcStack_b88 = (code *)0x12efb8;
      test_bson_json_array_single_cold_5();
LAB_0012efb8:
      pcStack_b88 = (code *)0x12efbd;
      test_bson_json_array_single_cold_2();
    }
    else {
      unaff_R12 = (undefined1 *)(ulong)uVar4;
      puVar13 = auStack_b80;
      if (uVar4 == 0xffffffff) goto LAB_0012efb3;
      puVar13 = (undefined1 *)(ulong)uStack_afc;
      pcStack_b88 = (code *)0x12ef86;
      puVar5 = (undefined1 *)write(uVar3,unaff_R14,(size_t)puVar13);
      if (puVar5 != puVar13) goto LAB_0012efb8;
      unaff_R14 = (void *)(ulong)uStack_b7c;
      pcStack_b88 = (code *)0x12ef9e;
      pvVar6 = (void *)write(uVar4,puVar9,(size_t)unaff_R14);
      if (pvVar6 == unaff_R14) {
        pcStack_b88 = (code *)0x12efae;
        test_bson_json_array_single_cold_4();
        goto LAB_0012efae;
      }
    }
    pcStack_b88 = (code *)0x12efc2;
    test_bson_json_array_single_cold_3();
    unaff_R13 = puVar13;
  }
  pcStack_b88 = test_bson_json_array_int64;
  test_bson_json_array_single_cold_1();
  puVar5 = auStack_f80;
  puVar13 = auStack_f80;
  pcStack_f88 = (code *)0x12eff2;
  puStack_bb0 = puVar9;
  puStack_ba8 = unaff_R12;
  puStack_ba0 = unaff_R13;
  pvStack_b98 = unaff_R14;
  uStack_b90 = unaff_R15;
  pcStack_b88 = (code *)&pcStack_788;
  bson_init(auStack_f80);
  pcStack_f88 = (code *)0x12f00b;
  bson_append_int64(auStack_f80,"0",1,0x7b);
  pcStack_f88 = (code *)0x12f024;
  bson_append_int64(auStack_f80,"1",1,0x2a);
  pcStack_f88 = (code *)0x12f047;
  cVar1 = bson_init_from_json(auStack_f00,
                              "[ { \"$numberLong\" : \"123\" },  { \"$numberLong\" : \"42\" } ]",
                              0xffffffffffffffff,auStack_e38);
  puStack_fa0 = unaff_R13;
  if (cVar1 != '\0') {
    pcStack_f88 = (code *)0x12f05f;
    unaff_R14 = (void *)bson_get_data(auStack_f00);
    pcStack_f88 = (code *)0x12f06d;
    puVar5 = (undefined1 *)bson_get_data(auStack_f80);
    if (uStack_f7c == uStack_efc) {
      pcStack_f88 = (code *)0x12f086;
      pvVar6 = (void *)bson_get_data(auStack_f80);
      pcStack_f88 = (code *)0x12f096;
      pvVar7 = (void *)bson_get_data(auStack_f00);
      pcStack_f88 = (code *)0x12f0a5;
      iVar2 = bcmp(pvVar6,pvVar7,(ulong)uStack_f7c);
      if (iVar2 == 0) {
        pcStack_f88 = (code *)0x12f0b1;
        bson_destroy(auStack_f80);
        pcStack_f88 = (code *)0x12f0be;
        bson_destroy(auStack_f00);
        return;
      }
    }
    unaff_R12 = auStack_f00;
    pcStack_f88 = (code *)0x12f0df;
    uVar8 = bson_as_canonical_extended_json(unaff_R12,0);
    pcStack_f88 = (code *)0x12f0ef;
    bson_as_canonical_extended_json(auStack_f80,0);
    uVar3 = uStack_f7c;
    if (uStack_efc < uStack_f7c) {
      uVar3 = uStack_efc;
    }
    uVar4 = 0xffffffff;
    if (uVar3 != 0) {
      uVar3 = uStack_f7c;
      if (uStack_efc <= uStack_f7c) {
        uVar3 = uStack_efc;
      }
      lVar12 = 0;
      do {
        if (*(char *)((long)unaff_R14 + lVar12) != puVar5[lVar12]) {
          uVar4 = (uint)lVar12;
          break;
        }
        lVar12 = lVar12 + 1;
      } while (uVar3 != (uint)lVar12);
    }
    uVar3 = uStack_efc;
    if (uStack_efc < uStack_f7c) {
      uVar3 = uStack_f7c;
    }
    uVar3 = uVar3 - 1;
    if (uVar4 != 0xffffffff) {
      uVar3 = uVar4;
    }
    pcStack_f88 = (code *)0x12f156;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",(ulong)uVar3,uVar8);
    pcStack_f88 = (code *)0x12f16e;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    unaff_R15 = (ulong)uVar3;
    pcStack_f88 = (code *)0x12f189;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    if (uVar3 == 0xffffffff) {
LAB_0012f1d5:
      pcStack_f88 = (code *)0x12f1da;
      test_bson_json_array_int64_cold_6();
LAB_0012f1da:
      pcStack_f88 = (code *)0x12f1df;
      test_bson_json_array_int64_cold_5();
LAB_0012f1df:
      pcStack_f88 = (code *)0x12f1e4;
      test_bson_json_array_int64_cold_2();
    }
    else {
      unaff_R12 = (undefined1 *)(ulong)uVar4;
      puVar13 = auStack_f80;
      if (uVar4 == 0xffffffff) goto LAB_0012f1da;
      puVar13 = (undefined1 *)(ulong)uStack_efc;
      pcStack_f88 = (code *)0x12f1ad;
      puVar9 = (undefined1 *)write(uVar3,unaff_R14,(size_t)puVar13);
      if (puVar9 != puVar13) goto LAB_0012f1df;
      unaff_R14 = (void *)(ulong)uStack_f7c;
      pcStack_f88 = (code *)0x12f1c5;
      pvVar6 = (void *)write(uVar4,puVar5,(size_t)unaff_R14);
      if (pvVar6 == unaff_R14) {
        pcStack_f88 = (code *)0x12f1d5;
        test_bson_json_array_int64_cold_4();
        goto LAB_0012f1d5;
      }
    }
    pcStack_f88 = (code *)0x12f1e9;
    test_bson_json_array_int64_cold_3();
    puStack_fa0 = puVar13;
  }
  pcStack_f88 = test_bson_json_array_subdoc;
  test_bson_json_array_int64_cold_1();
  puStack_fb0 = puVar5;
  puStack_fa8 = unaff_R12;
  pvStack_f98 = unaff_R14;
  uStack_f90 = unaff_R15;
  pcStack_f88 = (code *)&pcStack_b88;
  bson_init(auStack_1400);
  bson_init(auStack_1300);
  bson_append_int32(auStack_1300,"a",1,0x7b);
  bson_append_document(auStack_1400,"0",1,auStack_1300);
  cVar1 = bson_init_from_json(auStack_1380,"[ { \"a\" : 123 } ]",0xffffffffffffffff,auStack_1238);
  if (cVar1 == '\0') goto LAB_0012f41e;
  pvVar6 = (void *)bson_get_data(auStack_1380);
  pvVar7 = (void *)bson_get_data(auStack_1400);
  if (uStack_13fc == uStack_137c) {
    __s1 = (void *)bson_get_data(auStack_1400);
    __s2 = (void *)bson_get_data(auStack_1380);
    iVar2 = bcmp(__s1,__s2,(ulong)uStack_13fc);
    if (iVar2 == 0) {
      bson_destroy(auStack_1400);
      bson_destroy(auStack_1380);
      return;
    }
  }
  uVar8 = bson_as_canonical_extended_json(auStack_1380,0);
  uVar10 = bson_as_canonical_extended_json(auStack_1400,0);
  uVar3 = uStack_13fc;
  if (uStack_137c < uStack_13fc) {
    uVar3 = uStack_137c;
  }
  uVar4 = 0xffffffff;
  if (uVar3 != 0) {
    uVar3 = uStack_13fc;
    if (uStack_137c <= uStack_13fc) {
      uVar3 = uStack_137c;
    }
    lVar12 = 0;
    do {
      if (*(char *)((long)pvVar6 + lVar12) != *(char *)((long)pvVar7 + lVar12)) {
        uVar4 = (uint)lVar12;
        break;
      }
      lVar12 = lVar12 + 1;
    } while (uVar3 != (uint)lVar12);
  }
  uVar3 = uStack_137c;
  if (uStack_137c < uStack_13fc) {
    uVar3 = uStack_13fc;
  }
  uVar3 = uVar3 - 1;
  if (uVar4 != 0xffffffff) {
    uVar3 = uVar4;
  }
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",(ulong)uVar3,uVar8,uVar10);
  iVar2 = open("failure.bad.bson",0x42,0x1a0);
  __fd = open("failure.expected.bson",0x42,0x1a0);
  if (iVar2 == -1) {
LAB_0012f40a:
    test_bson_json_array_subdoc_cold_6();
LAB_0012f40f:
    test_bson_json_array_subdoc_cold_5();
LAB_0012f414:
    test_bson_json_array_subdoc_cold_2();
  }
  else {
    if (__fd == -1) goto LAB_0012f40f;
    uVar11 = write(iVar2,pvVar6,(ulong)uStack_137c);
    if (uVar11 != uStack_137c) goto LAB_0012f414;
    uVar11 = write(__fd,pvVar7,(ulong)uStack_13fc);
    if (uVar11 == uStack_13fc) {
      test_bson_json_array_subdoc_cold_4();
      goto LAB_0012f40a;
    }
  }
  test_bson_json_array_subdoc_cold_3();
LAB_0012f41e:
  test_bson_json_array_subdoc_cold_1();
  test_bson_json_date_check
            ("{ \"dt\" : { \"$date\" : \"2016-12-13T12:34:56.123Z\" } }",0x158f82db9fb);
  test_bson_json_date_check("{ \"dt\" : { \"$date\" : \"1970-01-01T00:00:00.000Z\" } }",0);
  test_bson_json_date_check("{ \"dt\" : { \"$date\" : \"1969-12-31T16:00:00.000-0800\" } }",0);
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000+01:00\" } }","Could not parse");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:30:\" } }",
             "reached end of date while looking for seconds");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:+01:00\" } }","seconds is required");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:30:00.\" } }",
             "reached end of date while looking for milliseconds");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.+01:00\" } }",
             "milliseconds is required");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"foo-01-01T00:00:00.000Z\" } }","year must be an integer");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-foo-01T00:00:00.000Z\" } }","month must be an integer"
            );
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-fooT00:00:00.000Z\" } }","day must be an integer");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01Tfoo:00:00.000Z\" } }","hour must be an integer")
  ;
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T00:foo:00.000Z\" } }",
             "minute must be an integer");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T00:00:foo.000Z\" } }",
             "seconds must be an integer");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000\" } }","timezone is required");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000X\" } }","timezone is required");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000+1\" } }","could not parse timezone"
            );
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000+xx00\" } }",
             "could not parse timezone");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000+2400\" } }",
             "timezone hour must be at most 23");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000-2400\" } }",
             "timezone hour must be at most 23");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000+0060\" } }",
             "timezone minute must be at most 59");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000-0060\" } }",
             "timezone minute must be at most 59");
  return;
}

Assistant:

static void
test_bson_json_inc (void)
{
   /* test that reproduces a bug with special mode checking.  Specifically,
    * mistaking '$inc' for '$id'
    *
    * From https://github.com/mongodb/mongo-c-driver/issues/62
    */
   bson_error_t error;
   const char *json = "{ \"$inc\" : { \"ref\" : 1 } }";
   bson_t b;
   bool r;

   r = bson_init_from_json (&b, json, -1, &error);
   if (!r)
      fprintf (stderr, "%s\n", error.message);
   BSON_ASSERT (r);
   bson_destroy (&b);
}